

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
emplaceRealloc<slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::EdgeKind&,std::span<std::array<char,2ul>,18446744073709551615ul>>
          (SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *this,pointer pos,
          Expression *args,Expression **args_1,EdgeKind *args_2,
          span<std::array<char,_2UL>,_18446744073709551615UL> *args_3)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  EdgeKind EVar3;
  ulong uVar4;
  Expression *pEVar5;
  pointer p;
  size_type sVar6;
  pointer paVar7;
  size_t sVar8;
  Expression *pEVar9;
  pointer paVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  pointer pAVar14;
  pointer pAVar15;
  undefined4 uVar16;
  pointer pAVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  uVar19 = this->len + 1;
  uVar4 = this->cap;
  if (uVar19 < uVar4 * 2) {
    uVar19 = uVar4 * 2;
  }
  if (0x333333333333333 - uVar4 < uVar4) {
    uVar19 = 0x333333333333333;
  }
  lVar20 = (long)pos - (long)this->data_;
  pAVar17 = (pointer)operator_new(uVar19 * 0x28);
  pEVar5 = *args_1;
  EVar3 = *args_2;
  paVar7 = args_3->_M_ptr;
  sVar8 = (args_3->_M_extent)._M_extent_value;
  *(Expression **)((long)pAVar17 + lVar20) = args;
  *(Expression **)((long)pAVar17 + lVar20 + 8) = pEVar5;
  *(EdgeKind *)((long)pAVar17 + lVar20 + 0x10) = EVar3;
  puVar1 = (undefined8 *)((long)pAVar17 + lVar20 + 0x18);
  *puVar1 = paVar7;
  puVar1[1] = sVar8;
  p = this->data_;
  sVar6 = this->len;
  lVar18 = (long)p + (sVar6 * 0x28 - (long)pos);
  pAVar14 = p;
  pAVar15 = pAVar17;
  if (lVar18 == 0) {
    if (sVar6 != 0) {
      lVar18 = 0;
      do {
        *(undefined8 *)((long)&(pAVar17->edgeDescriptors)._M_extent._M_extent_value + lVar18) =
             *(undefined8 *)((long)&(p->edgeDescriptors)._M_extent._M_extent_value + lVar18);
        puVar1 = (undefined8 *)((long)&p->expr + lVar18);
        uVar11 = *puVar1;
        uVar12 = puVar1[1];
        puVar1 = (undefined8 *)((long)&p->edge + lVar18);
        uVar13 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pAVar17->edge + lVar18);
        *puVar2 = *puVar1;
        puVar2[1] = uVar13;
        puVar1 = (undefined8 *)((long)&pAVar17->expr + lVar18);
        *puVar1 = uVar11;
        puVar1[1] = uVar12;
        lVar18 = lVar18 + 0x28;
      } while (sVar6 * 0x28 != lVar18);
    }
  }
  else {
    for (; pAVar14 != pos; pAVar14 = pAVar14 + 1) {
      (pAVar15->edgeDescriptors)._M_extent._M_extent_value =
           (pAVar14->edgeDescriptors)._M_extent._M_extent_value;
      pEVar5 = pAVar14->expr;
      pEVar9 = pAVar14->condition;
      uVar16 = *(undefined4 *)&pAVar14->field_0x14;
      paVar10 = (pAVar14->edgeDescriptors)._M_ptr;
      pAVar15->edge = pAVar14->edge;
      *(undefined4 *)&pAVar15->field_0x14 = uVar16;
      (pAVar15->edgeDescriptors)._M_ptr = paVar10;
      pAVar15->expr = pEVar5;
      pAVar15->condition = pEVar9;
      pAVar15 = pAVar15 + 1;
    }
    memcpy((void *)((long)pAVar17 + lVar20 + 0x28),pos,((lVar18 - 0x28U) / 0x28) * 0x28 + 0x28);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar19;
  this->data_ = pAVar17;
  return (pointer)((long)pAVar17 + lVar20);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}